

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O0

ostream * websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::
          timestamp(ostream *os)

{
  size_t sVar1;
  ostream *poVar2;
  size_t *local_80;
  size_t result;
  char buffer [20];
  tm lt;
  time_t t;
  ostream *os_local;
  
  lt.tm_zone = (char *)time((time_t *)0x0);
  lib::localtime((lib *)(buffer + 0x10),(time_t *)&lt.tm_zone);
  sVar1 = strftime((char *)&result,0x14,"%Y-%m-%d %H:%M:%S",(tm *)(buffer + 0x10));
  if (sVar1 == 0) {
    local_80 = (size_t *)0x1f3621;
  }
  else {
    local_80 = &result;
  }
  poVar2 = std::operator<<(os,(char *)local_80);
  return poVar2;
}

Assistant:

static std::ostream & timestamp(std::ostream & os) {
        std::time_t t = std::time(NULL);
        std::tm lt = lib::localtime(t);
        #ifdef _WEBSOCKETPP_PUTTIME_
            return os << std::put_time(&lt,"%Y-%m-%d %H:%M:%S");
        #else // Falls back to strftime, which requires a temporary copy of the string.
            char buffer[20];
            size_t result = std::strftime(buffer,sizeof(buffer),"%Y-%m-%d %H:%M:%S",&lt);
            return os << (result == 0 ? "Unknown" : buffer);
        #endif
    }